

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O3

LOCK_HANDLE IoTHubTransport_GetLock(TRANSPORT_HANDLE transportHandle)

{
  if (transportHandle != (TRANSPORT_HANDLE)0x0) {
    return transportHandle->lockHandle;
  }
  return (LOCK_HANDLE)0x0;
}

Assistant:

LOCK_HANDLE IoTHubTransport_GetLock(TRANSPORT_HANDLE transportHandle)
{
    LOCK_HANDLE lock;
    if (transportHandle == NULL)
    {
        lock = NULL;
    }
    else
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;
        lock = transportData->lockHandle;
    }
    return lock;
}